

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

Vec_Wrd_t * Zyx_ManTruthTables(Zyx_Man_t *p,word *pTruth)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  int local_24;
  int nMints;
  int i;
  Vec_Wrd_t *vInfo;
  word *pTruth_local;
  Zyx_Man_t *p_local;
  
  pVVar3 = Vec_WrdStart(p->nWords * (p->nObjs + 1));
  p->vInfo = pVVar3;
  iVar1 = Abc_MaxInt(0x40,1 << ((byte)p->pPars->nVars & 0x1f));
  if (p->pPars->fMajority == (uint)(pTruth == (word *)0x0)) {
    for (local_24 = 0; local_24 < p->pPars->nVars; local_24 = local_24 + 1) {
      pwVar4 = Zyx_ManTruth(p,local_24);
      Abc_TtIthVar(pwVar4,local_24,p->pPars->nVars);
    }
    if (p->pPars->fMajority != 0) {
      for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
        iVar2 = Zyx_ManValue(local_24,p->pPars->nVars);
        if (iVar2 != 0) {
          pwVar4 = Zyx_ManTruth(p,p->nObjs);
          Abc_TtSetBit(pwVar4,local_24);
        }
      }
      for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
        iVar2 = Abc_TtBitCount16(local_24);
        if ((iVar2 == p->pPars->nVars / 2) ||
           (iVar2 = Abc_TtBitCount16(local_24), iVar2 == p->pPars->nVars / 2 + 1)) {
          Vec_IntPush(p->vMidMints,local_24);
        }
      }
    }
    return pVVar3;
  }
  __assert_fail("p->pPars->fMajority == (pTruth == NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                ,0x2f5,"Vec_Wrd_t *Zyx_ManTruthTables(Zyx_Man_t *, word *)");
}

Assistant:

Vec_Wrd_t * Zyx_ManTruthTables( Zyx_Man_t * p, word * pTruth )
{
    Vec_Wrd_t * vInfo = p->vInfo = Vec_WrdStart( p->nWords * (p->nObjs + 1) ); 
    int i, nMints = Abc_MaxInt( 64, 1 << p->pPars->nVars );
    assert( p->pPars->fMajority == (pTruth == NULL) );
    for ( i = 0; i < p->pPars->nVars; i++ )
        Abc_TtIthVar( Zyx_ManTruth(p, i), i, p->pPars->nVars );
    if ( p->pPars->fMajority )
    {
        for ( i = 0; i < nMints; i++ )
            if ( Zyx_ManValue(i, p->pPars->nVars) )
                Abc_TtSetBit( Zyx_ManTruth(p, p->nObjs), i );
        for ( i = 0; i < nMints; i++ )
            if ( Abc_TtBitCount16(i) == p->pPars->nVars/2 || Abc_TtBitCount16(i) == p->pPars->nVars/2+1 )
                Vec_IntPush( p->vMidMints, i );
    }
    //Dau_DsdPrintFromTruth( Zyx_ManTruth(p, p->nObjs), p->pPars->nVars );
    return vInfo;
}